

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayoutInfo::setTabBarShape(QDockAreaLayoutInfo *this,int shape)

{
  long i_00;
  qsizetype qVar1;
  reference pQVar2;
  int in_ESI;
  QTabBar *in_RDI;
  QDockAreaLayoutItem *item;
  int i;
  undefined8 in_stack_ffffffffffffffd8;
  int iVar3;
  
  if (in_ESI != *(int *)&in_RDI[2].super_QWidget.field_0x18) {
    *(int *)&in_RDI[2].super_QWidget.field_0x18 = in_ESI;
    if (*(long *)&in_RDI[2].super_QWidget.super_QPaintDevice != 0) {
      QTabBar::setShape(in_RDI,(Shape)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    }
    iVar3 = 0;
    while( true ) {
      i_00 = (long)iVar3;
      qVar1 = QList<QDockAreaLayoutItem>::size
                        ((QList<QDockAreaLayoutItem> *)&in_RDI[1].super_QWidget.field_0x18);
      if (qVar1 <= i_00) break;
      pQVar2 = QList<QDockAreaLayoutItem>::operator[]((QList<QDockAreaLayoutItem> *)in_RDI,i_00);
      if (pQVar2->subinfo != (QDockAreaLayoutInfo *)0x0) {
        setTabBarShape((QDockAreaLayoutInfo *)CONCAT44(in_ESI,iVar3),(int)((ulong)pQVar2 >> 0x20));
      }
      iVar3 = iVar3 + 1;
    }
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::setTabBarShape(int shape)
{
    if (shape == tabBarShape)
        return;
    tabBarShape = shape;
    if (tabBar != nullptr)
        tabBar->setShape(static_cast<QTabBar::Shape>(shape));

    for (int i = 0; i < item_list.size(); ++i) {
        QDockAreaLayoutItem &item = item_list[i];
        if (item.subinfo != nullptr)
            item.subinfo->setTabBarShape(shape);
    }
}